

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LagrangePolynomial.cpp
# Opt level: O3

vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> * __thiscall
LagrangePolynomial::get_lagrange_polynomial
          (vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>
           *__return_storage_ptr__,LagrangePolynomial *this,
          vector<int,_std::allocator<int>_> *data_points,
          vector<poly,_std::allocator<poly>_> *basis_polynomial)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  element temp;
  vector<int,_std::allocator<int>_> local_70;
  value_type local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((data_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (data_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 0;
    do {
      local_58.p.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.p.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.p.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_58.p,
                  &(basis_polynomial->super__Vector_base<poly,_std::allocator<poly>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar3].numerators);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_70,
                 &(basis_polynomial->super__Vector_base<poly,_std::allocator<poly>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar3].denominators);
      if ((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
        local_58.denominator = 1;
        if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish != (pointer)0x0) goto LAB_00103f39;
      }
      else {
        lVar1 = (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        local_58.denominator = 1;
        lVar2 = 0;
        do {
          local_58.denominator =
               local_58.denominator *
               local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar1 + (ulong)(lVar1 == 0) != lVar2);
LAB_00103f39:
        operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_58.multiple =
           (int64_t)(data_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar3];
      std::vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>::
      push_back(__return_storage_ptr__,&local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58.p);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(data_points->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(data_points->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<LagrangePolynomial::element> LagrangePolynomial::get_lagrange_polynomial(vector<int> data_points, vector<poly> basis_polynomial) {
    vector<element> result_polynomial;

    for(int i=0; i<data_points.size(); i++){
        element temp;
        
        temp.p = basis_polynomial[i].numerators;
        temp.denominator = find_product(basis_polynomial[i].denominators);
        temp.multiple = data_points[i];

        result_polynomial.push_back(temp);
    }

    return result_polynomial;
}